

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_239414::AlsaPlayback::mixerProc(AlsaPlayback *this)

{
  uint uVar1;
  ALCdevice *pAVar2;
  undefined4 uVar3;
  FILE *__stream;
  uint uVar4;
  ALuint AVar5;
  int iVar6;
  ulong uVar7;
  snd_pcm_uframes_t sVar8;
  undefined8 uVar9;
  char *pcVar10;
  FILE *pFVar11;
  ulong uVar12;
  snd_pcm_uframes_t sVar13;
  snd_pcm_uframes_t frames;
  pthread_mutex_t *local_50;
  snd_pcm_uframes_t offset;
  uint local_3c;
  snd_pcm_channel_area_t *areas;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  AVar5 = ALCdevice::bytesFromFmt((this->super_BackendBase).mDevice);
  local_3c = AVar5 << 3;
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar12 = (ulong)pAVar2->UpdateSize;
  uVar1 = pAVar2->BufferSize;
  local_50 = (pthread_mutex_t *)&this->mMutex;
LAB_0015b56d:
  do {
    while( true ) {
      while( true ) {
        if (((this->mKillNow)._M_base._M_i & 1U) != 0) {
          return 0;
        }
        iVar6 = verify_state(this->mPcmHandle);
        __stream = gLogFile;
        if (iVar6 < 0) {
          if (0 < (int)gLogLevel) {
            uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
            fprintf((FILE *)__stream,"[ALSOFT] (EE) Invalid state detected: %s\n",uVar9);
          }
          pAVar2 = (this->super_BackendBase).mDevice;
          uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
          ALCdevice::handleDisconnect(pAVar2,"Bad state: %s",uVar9);
          return 0;
        }
        uVar7 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
        pFVar11 = (FILE *)gLogFile;
        if ((long)uVar7 < 0) goto LAB_0015b5c5;
        if (uVar7 <= uVar1) break;
        if (1 < (int)gLogLevel) {
          fwrite("[ALSOFT] (WW) available samples exceeds the buffer size\n",0x38,1,(FILE *)gLogFile
                );
        }
        (*(anonymous_namespace)::psnd_pcm_reset)(this->mPcmHandle);
      }
      if (uVar7 < uVar12) break;
      std::mutex::lock((mutex *)&local_50->__data);
      uVar4 = local_3c;
      for (sVar13 = uVar7 - uVar7 % uVar12; sVar13 != 0; sVar13 = sVar13 - sVar8) {
        areas = (snd_pcm_channel_area_t *)0x0;
        offset = 0;
        frames = sVar13;
        iVar6 = (*(anonymous_namespace)::psnd_pcm_mmap_begin)
                          (this->mPcmHandle,&areas,&offset,&frames);
        pFVar11 = (FILE *)gLogFile;
        if (iVar6 < 0) {
          if (0 < (int)gLogLevel) {
            uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
            pcVar10 = "[ALSOFT] (EE) mmap begin error: %s\n";
LAB_0015b7df:
            fprintf(pFVar11,pcVar10,uVar9);
          }
          break;
        }
        ALCdevice::renderSamples
                  ((this->super_BackendBase).mDevice,
                   (void *)((areas->step * offset >> 3) + (long)areas->addr),(ALuint)frames,
                   (ulong)areas->step / (ulong)uVar4);
        sVar8 = (*(anonymous_namespace)::psnd_pcm_mmap_commit)(this->mPcmHandle,offset,frames);
        pFVar11 = (FILE *)gLogFile;
        if (((long)sVar8 < 0) || (sVar8 != frames)) {
          if (0 < (int)gLogLevel) {
            uVar3 = (undefined4)sVar8;
            if (-1 < (long)sVar8) {
              uVar3 = 0xffffffe0;
            }
            uVar9 = (*(anonymous_namespace)::psnd_strerror)(uVar3);
            pcVar10 = "[ALSOFT] (EE) mmap commit error: %s\n";
            goto LAB_0015b7df;
          }
          break;
        }
      }
      pthread_mutex_unlock(local_50);
    }
    if ((iVar6 != 3) &&
       (iVar6 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle),
       pFVar11 = (FILE *)gLogFile, iVar6 < 0)) {
      if (0 < (int)gLogLevel) {
        uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
        pcVar10 = "[ALSOFT] (EE) start failed: %s\n";
        goto LAB_0015b5f4;
      }
      goto LAB_0015b56d;
    }
    iVar6 = (*(anonymous_namespace)::psnd_pcm_wait)(this->mPcmHandle,1000);
    if ((iVar6 == 0) && (0 < (int)gLogLevel)) {
      fwrite("[ALSOFT] (EE) Wait timeout... buffer size too low?\n",0x33,1,(FILE *)gLogFile);
    }
  } while( true );
LAB_0015b5c5:
  if (0 < (int)gLogLevel) {
    uVar9 = (*(anonymous_namespace)::psnd_strerror)(uVar7 & 0xffffffff);
    pcVar10 = "[ALSOFT] (EE) available update failed: %s\n";
LAB_0015b5f4:
    fprintf(pFVar11,pcVar10,uVar9);
  }
  goto LAB_0015b56d;
}

Assistant:

int AlsaPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t samplebits{mDevice->bytesFromFmt() * 8};
    const snd_pcm_uframes_t update_size{mDevice->UpdateSize};
    const snd_pcm_uframes_t buffer_size{mDevice->BufferSize};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        int state{verify_state(mPcmHandle)};
        if(state < 0)
        {
            ERR("Invalid state detected: %s\n", snd_strerror(state));
            mDevice->handleDisconnect("Bad state: %s", snd_strerror(state));
            break;
        }

        snd_pcm_sframes_t avails{snd_pcm_avail_update(mPcmHandle)};
        if(avails < 0)
        {
            ERR("available update failed: %s\n", snd_strerror(static_cast<int>(avails)));
            continue;
        }
        snd_pcm_uframes_t avail{static_cast<snd_pcm_uframes_t>(avails)};

        if(avail > buffer_size)
        {
            WARN("available samples exceeds the buffer size\n");
            snd_pcm_reset(mPcmHandle);
            continue;
        }

        // make sure there's frames to process
        if(avail < update_size)
        {
            if(state != SND_PCM_STATE_RUNNING)
            {
                int err{snd_pcm_start(mPcmHandle)};
                if(err < 0)
                {
                    ERR("start failed: %s\n", snd_strerror(err));
                    continue;
                }
            }
            if(snd_pcm_wait(mPcmHandle, 1000) == 0)
                ERR("Wait timeout... buffer size too low?\n");
            continue;
        }
        avail -= avail%update_size;

        // it is possible that contiguous areas are smaller, thus we use a loop
        std::lock_guard<std::mutex> _{mMutex};
        while(avail > 0)
        {
            snd_pcm_uframes_t frames{avail};

            const snd_pcm_channel_area_t *areas{};
            snd_pcm_uframes_t offset{};
            int err{snd_pcm_mmap_begin(mPcmHandle, &areas, &offset, &frames)};
            if(err < 0)
            {
                ERR("mmap begin error: %s\n", snd_strerror(err));
                break;
            }

            char *WritePtr{static_cast<char*>(areas->addr) + (offset * areas->step / 8)};
            mDevice->renderSamples(WritePtr, static_cast<ALuint>(frames), areas->step/samplebits);

            snd_pcm_sframes_t commitres{snd_pcm_mmap_commit(mPcmHandle, offset, frames)};
            if(commitres < 0 || static_cast<snd_pcm_uframes_t>(commitres) != frames)
            {
                ERR("mmap commit error: %s\n",
                    snd_strerror(commitres >= 0 ? -EPIPE : static_cast<int>(commitres)));
                break;
            }

            avail -= frames;
        }
    }

    return 0;
}